

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_error_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSValue val;
  JSValue func_obj;
  JSValue v;
  JSValue val_00;
  JSValue val_01;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v_00;
  JSValue v_01;
  JSValue items;
  JSValue error_obj;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  JSValue JVar4;
  JSValue error_list;
  JSContext *in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  undefined1 in_stack_00000038 [16];
  JSValue proto1;
  JSContext *realm;
  JSValue message;
  JSValue proto;
  JSValue msg;
  JSValue obj;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffecc;
  JSContext *in_stack_fffffffffffffed0;
  JSValue in_stack_fffffffffffffed8;
  JSValue in_stack_fffffffffffffee8;
  void *local_100;
  JSContext *in_stack_ffffffffffffff08;
  JSValueUnion ctx_00;
  undefined4 in_stack_ffffffffffffff10;
  JSAtom in_stack_ffffffffffffff14;
  JSValueUnion in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSContext *in_stack_ffffffffffffff28;
  JSValueUnion local_c0;
  int64_t local_b8;
  undefined4 uStack_ac;
  int64_t local_a8;
  JSValueUnion in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar7;
  JSValueUnion local_38;
  JSValueUnion local_10;
  JSValueUnion local_8;
  
  JVar4.tag = in_RDX;
  JVar4.u.float64 = in_RSI.float64;
  iVar2 = JS_IsUndefined(JVar4);
  if (iVar2 != 0) {
    JVar4 = JS_GetActiveFunction(in_RDI);
    local_c0 = JVar4.u;
    local_b8 = JVar4.tag;
    in_RSI = local_c0;
    in_RDX = local_b8;
  }
  uVar5 = 0;
  JVar4 = JS_GetPropertyInternal
                    (in_stack_00000020,(JSValue)in_stack_00000038,error_list.tag._4_4_,
                     (JSValue)in_stack_00000028,(BOOL)obj.tag);
  local_10 = JVar4.u;
  local_8 = (JSValueUnion)JVar4.tag;
  ctx_00 = local_10;
  local_38 = local_8;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 != 0) {
    iVar6 = ctx_00.int32;
    uVar7 = ctx_00._4_4_;
    goto LAB_0014ee85;
  }
  v_01.tag = (int64_t)local_38.ptr;
  v_01.u.float64 = ctx_00.float64;
  iVar2 = JS_IsObject(v_01);
  if (iVar2 == 0) {
    JS_FreeValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    func_obj.u._4_4_ = in_stack_ffffffffffffff14;
    func_obj.u.int32 = in_stack_ffffffffffffff10;
    func_obj.tag = (int64_t)in_stack_ffffffffffffff18.ptr;
    in_stack_ffffffffffffff28 = JS_GetFunctionRealm(in_stack_ffffffffffffff08,func_obj);
    if (in_stack_ffffffffffffff28 == (JSContext *)0x0) {
      iVar6 = 0;
      local_38.float64 = 2.96439387504748e-323;
      uVar7 = in_stack_ffffffffffffffc4;
      goto LAB_0014ee85;
    }
    if (in_R9D < 0) {
      in_stack_ffffffffffffff18 = (JSValueUnion)in_stack_ffffffffffffff28->class_proto[3].u.ptr;
      in_stack_ffffffffffffff20 = (JSValueUnion)in_stack_ffffffffffffff28->class_proto[3].tag;
    }
    else {
      in_stack_ffffffffffffff18 =
           (JSValueUnion)in_stack_ffffffffffffff28->native_error_proto[in_R9D].u.ptr;
      in_stack_ffffffffffffff20 =
           (JSValueUnion)(&in_stack_ffffffffffffff28->native_error_proto[in_R9D].u)[1].ptr;
    }
    v.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    v.u.float64 = in_stack_ffffffffffffff18.float64;
    JVar4 = JS_DupValue(in_RDI,v);
    ctx_00 = JVar4.u;
    in_stack_ffffffffffffff14 = JVar4.tag._4_4_;
    local_38 = (JSValueUnion)JVar4.tag;
  }
  JVar4 = JS_NewObjectProtoClass
                    ((JSContext *)in_stack_fffffffffffffed8.tag,in_stack_fffffffffffffee8,
                     in_stack_fffffffffffffed8.u._4_4_);
  local_100 = (void *)JVar4.tag;
  JS_FreeValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
  iVar2 = JS_IsException(JVar4);
  iVar6 = JVar4.u._0_4_;
  uVar7 = JVar4.u._4_4_;
  if (iVar2 != 0) {
    local_38.ptr = local_100;
    goto LAB_0014ee85;
  }
  if (in_R9D == 7) {
    iVar2 = (int)in_R8[2];
    uStack_ac = (undefined4)((ulong)in_R8[2] >> 0x20);
    local_a8 = in_R8[3];
  }
  else {
    iVar2 = (int)*in_R8;
    uStack_ac = (undefined4)((ulong)*in_R8 >> 0x20);
    local_a8 = in_R8[1];
  }
  v_00.u._4_4_ = uStack_ac;
  v_00.u.int32 = iVar2;
  v_00.tag = local_a8;
  iVar3 = JS_IsUndefined(v_00);
  if (iVar3 == 0) {
    val.u._4_4_ = in_stack_fffffffffffffecc;
    val.u.int32 = uVar5;
    val.tag = (int64_t)in_stack_fffffffffffffed0;
    JVar4 = JS_ToString((JSContext *)0x14ecfe,val);
    in_stack_ffffffffffffff70 = JVar4.u;
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      this_obj.tag = (int64_t)local_8.ptr;
      this_obj.u.ptr = local_10.ptr;
      val_00.tag = (int64_t)in_stack_ffffffffffffff28;
      val_00.u.ptr = in_stack_ffffffffffffff20.ptr;
      JS_DefinePropertyValue
                ((JSContext *)in_stack_ffffffffffffff18.ptr,this_obj,in_stack_ffffffffffffff14,
                 val_00,iVar2);
      goto LAB_0014ed8c;
    }
LAB_0014ee51:
    JS_FreeValue(in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    iVar6 = 0;
    local_38.float64 = 2.96439387504748e-323;
    uVar7 = in_stack_ffffffffffffffc4;
  }
  else {
LAB_0014ed8c:
    if (in_R9D == 7) {
      items.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      items.u.float64 = local_38.float64;
      in_stack_fffffffffffffed8 = iterator_to_array((JSContext *)ctx_00.ptr,items);
      iVar3 = JS_IsException(in_stack_fffffffffffffed8);
      if (iVar3 != 0) goto LAB_0014ee51;
      this_obj_00.tag = (int64_t)local_8.ptr;
      this_obj_00.u.float64 = local_10.float64;
      val_01.tag = (int64_t)in_stack_ffffffffffffff28;
      val_01.u.float64 = in_stack_ffffffffffffff20.float64;
      JS_DefinePropertyValue
                ((JSContext *)in_stack_ffffffffffffff18.ptr,this_obj_00,in_stack_ffffffffffffff14,
                 val_01,iVar2);
    }
    error_obj.tag._0_4_ = in_stack_ffffffffffffffc0;
    error_obj.u = (JSValueUnion)in_RDX;
    error_obj.tag._4_4_ = in_stack_ffffffffffffffc4;
    build_backtrace((JSContext *)in_RSI.ptr,error_obj,(char *)in_RDI,in_ECX,
                    in_stack_ffffffffffffffa0);
    local_38.ptr = local_100;
  }
LAB_0014ee85:
  JVar1.u._4_4_ = uVar7;
  JVar1.u.int32 = iVar6;
  JVar1.tag = (int64_t)local_38.ptr;
  return JVar1;
}

Assistant:

static JSValue js_error_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv, int magic)
{
    JSValue obj, msg, proto;
    JSValueConst message;

    if (JS_IsUndefined(new_target))
        new_target = JS_GetActiveFunction(ctx);
    proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
    if (JS_IsException(proto))
        return proto;
    if (!JS_IsObject(proto)) {
        JSContext *realm;
        JSValueConst proto1;
        
        JS_FreeValue(ctx, proto);
        realm = JS_GetFunctionRealm(ctx, new_target);
        if (!realm)
            return JS_EXCEPTION;
        if (magic < 0) {
            proto1 = realm->class_proto[JS_CLASS_ERROR];
        } else {
            proto1 = realm->native_error_proto[magic];
        }
        proto = JS_DupValue(ctx, proto1);
    }
    obj = JS_NewObjectProtoClass(ctx, proto, JS_CLASS_ERROR);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        return obj;
    if (magic == JS_AGGREGATE_ERROR) {
        message = argv[1];
    } else {
        message = argv[0];
    }

    if (!JS_IsUndefined(message)) {
        msg = JS_ToString(ctx, message);
        if (unlikely(JS_IsException(msg)))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message, msg,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    if (magic == JS_AGGREGATE_ERROR) {
        JSValue error_list = iterator_to_array(ctx, argv[0]);
        if (JS_IsException(error_list))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_errors, error_list,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    /* skip the Error() function in the backtrace */
    build_backtrace(ctx, obj, NULL, 0, JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL);
    return obj;
 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}